

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.h
# Opt level: O2

uint crnlib::pixel_format_helpers::get_dxt_bytes_per_block(pixel_format fmt)

{
  uint uVar1;
  
  uVar1 = 8;
  if ((((fmt != PIXEL_FMT_ETC1) && (fmt != PIXEL_FMT_DXT5A)) && (fmt != PIXEL_FMT_DXT1)) &&
     (fmt != PIXEL_FMT_ETC2)) {
    if (((fmt == PIXEL_FMT_3DC) || (fmt == PIXEL_FMT_DXT2)) ||
       ((fmt == PIXEL_FMT_DXT3 || ((fmt == PIXEL_FMT_DXT4 || (fmt == PIXEL_FMT_DXT5)))))) {
      return 0x10;
    }
    if (fmt != PIXEL_FMT_DXT1A) {
      if (fmt == PIXEL_FMT_DXT5_CCxY) {
        return 0x10;
      }
      if (fmt == PIXEL_FMT_DXT5_AGBR) {
        return 0x10;
      }
      if (fmt == PIXEL_FMT_DXT5_xGBR) {
        return 0x10;
      }
      if (fmt == PIXEL_FMT_DXT5_xGxR) {
        return 0x10;
      }
      if (fmt != PIXEL_FMT_ETC1S) {
        if (fmt == PIXEL_FMT_ETC2AS) {
          return 0x10;
        }
        if (fmt == PIXEL_FMT_DXN) {
          return 0x10;
        }
        if (fmt == PIXEL_FMT_ETC2A) {
          return 0x10;
        }
        uVar1 = 0;
      }
    }
  }
  return uVar1;
}

Assistant:

inline uint get_dxt_bytes_per_block(pixel_format fmt)
        {
            switch (fmt)
            {
            case PIXEL_FMT_DXT1:
                return 8;
            case PIXEL_FMT_DXT1A:
                return 8;
            case PIXEL_FMT_DXT5A:
                return 8;
            case PIXEL_FMT_ETC1:
                return 8;
            case PIXEL_FMT_ETC2:
                return 8;
            case PIXEL_FMT_ETC2A:
                return 16;
            case PIXEL_FMT_ETC1S:
                return 8;
            case PIXEL_FMT_ETC2AS:
                return 16;
            case PIXEL_FMT_DXT2:
                return 16;
            case PIXEL_FMT_DXT3:
                return 16;
            case PIXEL_FMT_DXT4:
                return 16;
            case PIXEL_FMT_DXT5:
                return 16;
            case PIXEL_FMT_3DC:
                return 16;
            case PIXEL_FMT_DXN:
                return 16;
            case PIXEL_FMT_DXT5_CCxY:
                return 16;
            case PIXEL_FMT_DXT5_xGxR:
                return 16;
            case PIXEL_FMT_DXT5_xGBR:
                return 16;
            case PIXEL_FMT_DXT5_AGBR:
                return 16;
            default:
                break;
            }
            CRNLIB_ASSERT(false);
            return 0;
        }